

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  size_t __n;
  char *__format;
  
  puts("*** LIBTRIE UNIT TESTS AND DEMO ***\n\n");
  if (argc < 2) {
    builtin_memcpy(dic_path,"../dic/english.txt",0x12);
  }
  else {
    __n = 0xffffffffffffffff;
    do {
      lVar1 = __n + 1;
      __n = __n + 1;
    } while (argv[1][lVar1] != '\0');
    memcpy(dic_path,argv[1],__n);
  }
  printf("dic_path %s\n",dic_path);
  __stream = fopen((char *)dic_path,"r");
  if (__stream == (FILE *)0x0) {
    printf("Unable to read dic: %s\n",dic_path);
    uVar3 = 1;
  }
  else {
    fclose(__stream);
    iVar2 = all_tests();
    if (iVar2 == 0) {
      __format = "Very good results! Tests passed: %d/%d\n";
      uVar3 = tests_passed;
    }
    else {
      __format = "Results. Tests failed/passed: %d/%d\n";
      uVar3 = tests_failed;
    }
    printf(__format,(ulong)uVar3,(ulong)(uint)tests_passed);
    uVar3 = (uint)(tests_failed != 0);
  }
  return uVar3;
}

Assistant:

int main(int argc, char **argv) {
    printf("*** LIBTRIE UNIT TESTS AND DEMO ***\n\n\n");
    //set dic_path if given
    if(argc > 1) {
        int len = 0;
        while (argv[1][len]){
            ++len;
        };
        memcpy(&dic_path, argv[1], len);
    } else{
        memcpy(&dic_path, "../dic/english.txt", 18);
    }

    printf("dic_path %s\n", dic_path);
    FILE *file = fopen(dic_path, "r");
    if (!file) {
        printf("Unable to read dic: %s\n", dic_path);
        return 1;
    }else{
        fclose(file);
    }

    all_tests() ? printf("Results. Tests failed/passed: %d/%d\n", tests_failed, tests_passed)
                : printf("Very good results! Tests passed: %d/%d\n", tests_passed, tests_passed);

    return tests_failed ? 1 : 0;
}